

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::Contains::Contains(Contains *this,Contains *other)

{
  long in_RSI;
  undefined8 *in_RDI;
  MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffe0;
  
  MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MatcherImpl(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__Contains_001ef360;
  std::__cxx11::string::string((string *)(in_RDI + 2),(string *)(in_RSI + 0x10));
  return;
}

Assistant:

Contains( Contains const& other ) : m_substr( other.m_substr ){}